

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

string * FIX::string_toUpper(string *__return_storage_ptr__,string *value)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + value->_M_string_length);
  sVar2 = __return_storage_ptr__->_M_string_length;
  if (sVar2 != 0) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      iVar3 = toupper((int)pcVar1[sVar4]);
      pcVar1[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string string_toUpper(const std::string &value) {
  std::string copy = value;
  std::transform(copy.begin(), copy.end(), copy.begin(), toupper);
  return copy;
}